

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O3

void __thiscall
lume::Neighborhoods::refresh
          (Neighborhoods *this,SPMesh *mesh,GrobSet centerGrobTypes,GrobSet neighborGrobTypes)

{
  ProfileMark *unaff_RBX;
  char *unaff_R14;
  ProfileMark peproMark_Neighborhoods__refresh;
  
  pepro::impl::ProfileStack::push(unaff_R14,unaff_RBX);
  (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(mesh->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  (this->m_centerGrobTypes).m_offset = centerGrobTypes.m_offset;
  (this->m_neighborGrobTypes).m_offset = neighborGrobTypes.m_offset;
  (this->m_nbrs).m_tupleSize = 2;
  impl::FillNeighborMap<lume::ArrayAnnex<unsigned_int>>
            (&this->m_nbrs,&this->m_offsets,this->m_grobBaseInds,
             (this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             centerGrobTypes,neighborGrobTypes);
  pepro::impl::ProfileStack::pop();
  return;
}

Assistant:

void Neighborhoods::
refresh (SPMesh mesh, GrobSet centerGrobTypes, GrobSet neighborGrobTypes)
{
	PEPRO_BEGIN(Neighborhoods__refresh);
	
	m_mesh = mesh;
	m_centerGrobTypes = centerGrobTypes;
	m_neighborGrobTypes = neighborGrobTypes;

	m_nbrs.set_tuple_size (2);
	impl::FillNeighborMap (m_nbrs, m_offsets, m_grobBaseInds, *m_mesh,
	                       m_centerGrobTypes, m_neighborGrobTypes);
}